

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O1

void __thiscall sciplot::Plot::boxWidthRelative(Plot *this,double val)

{
  long *plVar1;
  long *plVar2;
  string local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  double local_20;
  
  local_20 = val;
  internal::str<double>(&local_60,&local_20);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_30 = *plVar2;
    lStack_28 = plVar1[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar2;
    local_40 = (long *)*plVar1;
  }
  local_38 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_boxwidth,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline auto Plot::boxWidthRelative(double val) -> void
{
    m_boxwidth = internal::str(val) + " relative";
}